

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void StatInit(SuperLUStat_t *stat)

{
  double dVar1;
  long lVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  double *pdVar7;
  flops_t *pfVar8;
  long lVar9;
  undefined1 *puVar10;
  char msg [256];
  undefined1 auStack_118 [264];
  
  puVar10 = auStack_118;
  iVar4 = sp_ienv(1);
  iVar5 = sp_ienv(2);
  if (iVar4 <= iVar5) {
    iVar4 = iVar5;
  }
  piVar6 = int32Calloc(iVar4 + 1);
  stat->panel_histo = piVar6;
  pdVar7 = (double *)superlu_malloc(0xb0);
  stat->utime = pdVar7;
  if (pdVar7 == (double *)0x0) {
    StatInit_cold_2();
  }
  else {
    pfVar8 = (flops_t *)superlu_malloc(0x58);
    stat->ops = pfVar8;
    if (pfVar8 != (flops_t *)0x0) {
      pdVar7 = stat->utime;
      lVar9 = 0;
      do {
        pdVar7[lVar9] = 0.0;
        (pdVar7 + lVar9)[1] = 0.0;
        (pfVar8 + lVar9)[0] = 0.0;
        (pfVar8 + lVar9)[1] = 0.0;
        lVar9 = lVar9 + 2;
      } while (lVar9 != 0x16);
      stat->TinyPivots = 0;
      stat->RefineSteps = 0;
      stat->expansions = 0;
      return;
    }
  }
  StatInit_cold_1();
  lVar9 = *(long *)(puVar10 + 8);
  lVar2 = *(long *)(puVar10 + 0x10);
  printf("Factor time  = %8.5f\n",(int)*(undefined8 *)(lVar9 + 0x38));
  dVar1 = *(double *)(lVar9 + 0x38);
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar3 = (double)*(float *)(lVar2 + 0x1c);
    printf("Factor flops = %e\tMflops = %8.2f\n",SUB84(dVar3,0),(dVar3 * 1e-06) / dVar1);
  }
  printf("Solve time   = %8.4f\n",(int)*(undefined8 *)(lVar9 + 0x88));
  dVar1 = *(double *)(lVar9 + 0x88);
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar3 = (double)*(float *)(lVar2 + 0x44);
    printf("Solve flops = %e\tMflops = %8.2f\n",SUB84(dVar3,0),(dVar3 * 1e-06) / dVar1);
  }
  printf("Number of memory expansions: %d\n",(ulong)*(uint *)(puVar10 + 0x20));
  return;
}

Assistant:

void
StatInit(SuperLUStat_t *stat)
{
    register int i, w, panel_size, relax;

    panel_size = sp_ienv(1);
    relax = sp_ienv(2);
    w = SUPERLU_MAX(panel_size, relax);
    stat->panel_histo = int32Calloc(w+1);
    stat->utime = (double *) SUPERLU_MALLOC(NPHASES * sizeof(double));
    if (!stat->utime) ABORT("SUPERLU_MALLOC fails for stat->utime");
    stat->ops = (flops_t *) SUPERLU_MALLOC(NPHASES * sizeof(flops_t));
    if (!stat->ops) ABORT("SUPERLU_MALLOC fails for stat->ops");
    for (i = 0; i < NPHASES; ++i) {
        stat->utime[i] = 0.;
        stat->ops[i] = 0.;
    }
    stat->TinyPivots = 0;
    stat->RefineSteps = 0;
    stat->expansions = 0;
#if ( PRNTlevel >= 1 )
    printf(".. parameters in sp_ienv():\n");
    printf("\t 1: panel size \t %4d \n"
           "\t 2: relax      \t %4d \n"
           "\t 3: max. super \t %4d \n"
           "\t 4: row-dim 2D \t %4d \n"
           "\t 5: col-dim 2D \t %4d \n"
           "\t 6: fill ratio \t %4d \n",
	   sp_ienv(1), sp_ienv(2), sp_ienv(3), 
	   sp_ienv(4), sp_ienv(5), sp_ienv(6));
#endif
}